

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

bool re2::IsAnchorStart(Regexp **pre,int depth)

{
  uint8_t uVar1;
  ushort uVar2;
  Regexp *this;
  bool bVar3;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar4;
  Regexp *pRVar5;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar6;
  int i;
  ulong uVar7;
  Regexp *sub;
  PODArray<re2::Regexp_*> subcopy;
  
  this = *pre;
  if (3 < depth || this == (Regexp *)0x0) goto LAB_001aa2dd;
  uVar1 = this->op_;
  if (uVar1 == '\x12') {
    pRVar5 = Regexp::LiteralString((Rune *)0x0,0,(uint)this->parse_flags_);
LAB_001aa3df:
    *pre = pRVar5;
    Regexp::Decref(this);
LAB_001aa3ea:
    bVar3 = true;
  }
  else {
    if (uVar1 == '\v') {
      if (this->nsub_ < 2) {
        paVar6 = &this->field_5;
      }
      else {
        paVar6 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
      }
      sub = Regexp::Incref(paVar6->subone_);
      bVar3 = IsAnchorStart(&sub,depth + 1);
      if (bVar3) {
        pRVar5 = Regexp::Capture(sub,(uint)this->parse_flags_,(this->field_7).field_0.max_);
        goto LAB_001aa3df;
      }
LAB_001aa3fe:
      Regexp::Decref(sub);
    }
    else if ((uVar1 == '\x05') && (this->nsub_ != 0)) {
      paVar6 = &this->field_5;
      paVar4 = paVar6;
      if (this->nsub_ != 1) {
        paVar4 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
      }
      sub = Regexp::Incref(paVar4->subone_);
      bVar3 = IsAnchorStart(&sub,depth + 1);
      if (!bVar3) goto LAB_001aa3fe;
      PODArray<re2::Regexp_*>::PODArray(&subcopy,(uint)this->nsub_);
      *subcopy.ptr_._M_t.super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>
       ._M_t.super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>.
       super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl = sub;
      for (uVar7 = 1; uVar2 = this->nsub_, uVar7 < uVar2; uVar7 = uVar7 + 1) {
        paVar4 = paVar6;
        if (1 < uVar2) {
          paVar4 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)paVar6->submany_;
        }
        pRVar5 = Regexp::Incref(paVar4[uVar7].subone_);
        subcopy.ptr_._M_t.
        super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>._M_t.
        super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>.
        super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl[uVar7] = pRVar5;
      }
      pRVar5 = Regexp::Concat(subcopy.ptr_._M_t.
                              super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>
                              .super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl,(uint)uVar2
                              ,(uint)this->parse_flags_);
      *pre = pRVar5;
      Regexp::Decref(this);
      std::unique_ptr<re2::Regexp_*[],_re2::PODArray<re2::Regexp_*>::Deleter>::~unique_ptr
                (&subcopy.ptr_);
      goto LAB_001aa3ea;
    }
LAB_001aa2dd:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool IsAnchorStart(Regexp** pre, int depth) {
  Regexp* re = *pre;
  Regexp* sub;
  // The depth limit makes sure that we don't overflow
  // the stack on a deeply nested regexp.  As the comment
  // above says, IsAnchorStart is conservative, so returning
  // a false negative is okay.  The exact limit is somewhat arbitrary.
  if (re == NULL || depth >= 4)
    return false;
  switch (re->op()) {
    default:
      break;
    case kRegexpConcat:
      if (re->nsub() > 0) {
        sub = re->sub()[0]->Incref();
        if (IsAnchorStart(&sub, depth+1)) {
          PODArray<Regexp*> subcopy(re->nsub());
          subcopy[0] = sub;  // already have reference
          for (int i = 1; i < re->nsub(); i++)
            subcopy[i] = re->sub()[i]->Incref();
          *pre = Regexp::Concat(subcopy.data(), re->nsub(), re->parse_flags());
          re->Decref();
          return true;
        }
        sub->Decref();
      }
      break;
    case kRegexpCapture:
      sub = re->sub()[0]->Incref();
      if (IsAnchorStart(&sub, depth+1)) {
        *pre = Regexp::Capture(sub, re->parse_flags(), re->cap());
        re->Decref();
        return true;
      }
      sub->Decref();
      break;
    case kRegexpBeginText:
      *pre = Regexp::LiteralString(NULL, 0, re->parse_flags());
      re->Decref();
      return true;
  }
  return false;
}